

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledOutputFile.cpp
# Opt level: O0

bool __thiscall Imf_2_5::anon_unknown_5::TileCoord::operator<(TileCoord *this,TileCoord *other)

{
  bool local_23;
  bool local_22;
  bool local_21;
  bool local_11;
  TileCoord *other_local;
  TileCoord *this_local;
  
  local_11 = true;
  if ((other->ly <= this->ly) &&
     ((this->ly != other->ly || (local_11 = true, other->lx <= this->lx)))) {
    local_21 = false;
    if ((this->ly == other->ly) && (local_21 = false, this->lx == other->lx)) {
      local_22 = true;
      if (other->dy <= this->dy) {
        local_23 = false;
        if (this->dy == other->dy) {
          local_23 = this->dx < other->dx;
        }
        local_22 = local_23;
      }
      local_21 = local_22;
    }
    local_11 = local_21;
  }
  return local_11;
}

Assistant:

bool
    operator < (const TileCoord &other) const
    {
        return (ly < other.ly) ||
	       (ly == other.ly && lx < other.lx) ||
	       ((ly == other.ly && lx == other.lx) &&
		    ((dy < other.dy) || (dy == other.dy && dx < other.dx)));
    }